

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_lee_2021_brts.h
# Opt level: O2

void __thiscall BRTS<UFPC>::SecondScan(BRTS<UFPC> *this)

{
  ushort uVar1;
  uint uVar2;
  Mat1i *pMVar3;
  long lVar4;
  long lVar5;
  uint *puVar6;
  Run *pRVar7;
  int j;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  
  pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  uVar2 = *(uint *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x8;
  uVar10 = 0;
  memset(*(void **)&pMVar3->field_0x10,0,*(long *)&pMVar3->field_0x20 - *(long *)&pMVar3->field_0x18
        );
  pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  pRVar7 = (this->data_runs).runs;
  uVar9 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar9 = uVar10;
  }
  for (; puVar6 = UFPC::P_, uVar10 != uVar9; uVar10 = uVar10 + 1) {
    lVar4 = **(long **)&pMVar3->field_0x48;
    lVar5 = *(long *)&pMVar3->field_0x10;
    for (; uVar8 = (ulong)pRVar7->start_pos, uVar8 != 0xffff; pRVar7 = pRVar7 + 1) {
      uVar1 = pRVar7->end_pos;
      uVar2 = puVar6[pRVar7->label];
      for (; uVar8 < uVar1; uVar8 = uVar8 + 1) {
        *(uint *)(lVar4 * uVar10 + lVar5 + uVar8 * 4) = uVar2;
      }
    }
    pRVar7 = pRVar7 + 1;
  }
  return;
}

Assistant:

void SecondScan() {
        int w(img_.cols);
        int h(img_.rows);

        memset(img_labels_.data, 0, img_labels_.dataend - img_labels_.datastart);

        Run* runs = data_runs.runs;
        for (int i = 0; i < h; i++) {
            unsigned* const labels = img_labels_.ptr<unsigned>(i);
            for (;; runs++) {
                unsigned short start_pos = runs->start_pos;
                if (start_pos == 0xFFFF) {
                    runs++;
                    break;
                }
                unsigned short end_pos = runs->end_pos;
                int label = LabelsSolver::GetLabel(runs->label);
                for (int j = start_pos; j < end_pos; j++) labels[j] = label;
            }
        }
    }